

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,QList<QString>>::
emplaceValue<QList<QString>>
          (Node<QFontDatabasePrivate::ExtendedScript,QList<QString>> *this,QList<QString> *args)

{
  qsizetype qVar1;
  Data *pDVar2;
  QString *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<QString> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = (args->d).size;
  (args->d).size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  local_48.size = 0;
  pDVar2 = (args->d).d;
  pQVar3 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (QString *)0x0;
  local_28.d = *(Data **)(this + 8);
  local_28.ptr = *(QString **)(this + 0x10);
  *(Data **)(this + 8) = pDVar2;
  *(QString **)(this + 0x10) = pQVar3;
  local_28.size = *(qsizetype *)(this + 0x18);
  *(qsizetype *)(this + 0x18) = qVar1;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }